

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::CompositeCodec<FastPForLib::SIMDFastPFor<4U>,_FastPForLib::VariableByte>::
_decodeArray<unsigned_long>
          (CompositeCodec<FastPForLib::SIMDFastPFor<4U>,_FastPForLib::VariableByte> *this,
          uint32_t *in,size_t length,unsigned_long *out,size_t *nvalue)

{
  ulong uVar1;
  logic_error *plVar2;
  long lVar3;
  long in_RDX;
  uint32_t *in_RSI;
  VariableByte *in_RDI;
  ulong *in_R8;
  uint32_t *in3;
  size_t nvalue2;
  uint32_t *in2;
  size_t mynvalue1;
  uint32_t *initin;
  uint64_t *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  uint32_t *in_stack_ffffffffffffff88;
  uint64_t *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  uint32_t *in_stack_ffffffffffffffa8;
  IntegerCODEC *in_stack_ffffffffffffffb0;
  uint32_t *local_8;
  
  local_8 = in_RSI;
  if (*in_R8 != 0) {
    uVar1 = *in_R8;
    local_8 = IntegerCODEC::decodeArray
                        (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                         in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(size_t *)in_RDI);
    if (local_8 < in_RSI + in_RDX) {
      if (*in_R8 <= uVar1) {
        plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar2,"Buffer contains more data than requested!");
        __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      lVar3 = *in_R8 - uVar1;
      local_8 = VariableByte::decodeArray
                          (in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78,(size_t *)0x13d009);
      *in_R8 = uVar1 + lVar3;
      if (in_RSI + in_RDX < local_8) {
        plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar2,"Decode run over output buffer. Potential buffer overflow!");
        __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    else {
      *in_R8 = uVar1;
      if (in_RSI + in_RDX < local_8) {
        plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (plVar2,"Decode run over output buffer. Potential buffer overflow!");
        __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  return local_8;
}

Assistant:

const uint32_t *_decodeArray(const uint32_t *in, const size_t length,
                               IntType *out, size_t &nvalue) {
    if (nvalue == 0) {
      return in;
    }
    const uint32_t *const initin(in);
    size_t mynvalue1 = nvalue;
    const uint32_t *in2 = codec1.decodeArray(in, length, out, mynvalue1);
    if (length + in > in2) {
      if (nvalue <= mynvalue1) {
        throw std::logic_error("Buffer contains more data than requested!");
      }
      size_t nvalue2 = nvalue - mynvalue1;
      const uint32_t *in3 = codec2.decodeArray(in2, length - (in2 - in),
                                               out + mynvalue1, nvalue2);
      nvalue = mynvalue1 + nvalue2;
      if (initin + length < in3) {
        throw std::logic_error(
            "Decode run over output buffer. Potential buffer overflow!");
      }
      return in3;
    }
    nvalue = mynvalue1;
    if (initin + length < in2) {
      throw std::logic_error(
          "Decode run over output buffer. Potential buffer overflow!");
    }
    return in2;
  }